

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

RPCHelpMan * wallet::getaddressesbylabel(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff7a8;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff7b0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e0;
  allocator<char> *in_stack_fffffffffffff7e8;
  iterator in_stack_fffffffffffff7f0;
  RPCArgOptions *in_stack_fffffffffffff7f8;
  string *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff80f;
  undefined4 in_stack_fffffffffffff810;
  Type in_stack_fffffffffffff814;
  string *in_stack_fffffffffffff818;
  RPCArg *in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff828;
  Type in_stack_fffffffffffff82c;
  RPCResult *in_stack_fffffffffffff830;
  undefined1 *local_7b8;
  undefined1 *local_7a0;
  undefined1 *local_788;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  RPCHelpMan *this_00;
  allocator<char> local_63e;
  allocator<char> local_63d;
  allocator<char> local_63c;
  allocator<char> local_63b [3];
  pointer local_638;
  pointer pRStack_630;
  pointer local_628;
  allocator<char> local_61a;
  allocator<char> local_619 [31];
  allocator<char> local_5fa;
  allocator<char> local_5f9 [9];
  undefined8 in_stack_fffffffffffffa10;
  allocator<char> local_5da;
  allocator<char> local_5d9 [31];
  undefined1 local_5ba;
  undefined1 local_5b9 [8];
  vector<RPCArg,_std::allocator<RPCArg>_> local_5b1;
  undefined1 local_592 [322];
  undefined1 local_450 [136];
  undefined1 local_3c8 [64];
  undefined1 local_388 [136];
  undefined1 local_300 [200];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  description = (string *)local_592;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  args = &local_5b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  local_5b9._1_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff7b8,(Optional *)in_stack_fffffffffffff7b0);
  results = (RPCResults *)local_5b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff7c0);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff7a8);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff814,
                 (Fallback *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                 in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  examples = (RPCExamples *)&local_5ba;
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff7a8);
  __l._M_len = (size_type)in_stack_fffffffffffff7f8;
  __l._M_array = in_stack_fffffffffffff7f0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff7e8,__l,
             (allocator_type *)in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  local_638 = (pointer)0x0;
  pRStack_630 = (pointer)0x0;
  local_628 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7a8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff830,in_stack_fffffffffffff82c,&in_stack_fffffffffffff820->m_names
             ,in_stack_fffffffffffff818,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool)in_stack_fffffffffffff80f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff7a8);
  __l_00._M_len = (size_type)in_stack_fffffffffffff7f8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff7f0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7e8,__l_00,
             (allocator_type *)in_stack_fffffffffffff7e0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff830,in_stack_fffffffffffff82c,&in_stack_fffffffffffff820->m_names
             ,in_stack_fffffffffffff818,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool)in_stack_fffffffffffff80f);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff7a8);
  __l_01._M_len = (size_type)in_stack_fffffffffffff7f8;
  __l_01._M_array = (iterator)in_stack_fffffffffffff7f0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7e8,__l_01,
             (allocator_type *)in_stack_fffffffffffff7e0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff830,in_stack_fffffffffffff82c,&in_stack_fffffffffffff820->m_names
             ,in_stack_fffffffffffff818,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (bool)in_stack_fffffffffffff80f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
             (RPCResult *)in_stack_fffffffffffff820);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  HelpExampleCli(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7f8,(char *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  HelpExampleRpc(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  std::operator+(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff7a8,(string *)0xbf0c56);
  this = (RPCArg *)&stack0xfffffffffffff9a0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::getaddressesbylabel()::__0,void>
            (in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
  RPCHelpMan::RPCHelpMan
            (this_00,&in_RDI->m_name,description,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffffa10);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_63e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_63d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_63c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_63b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7b8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_788 = local_300;
  do {
    local_788 = local_788 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_788 != local_388);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7b8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_7a0 = local_3c8;
  do {
    local_7a0 = local_7a0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_7a0 != local_450);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7b8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_61a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_619);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_5fa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_5f9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_5da);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_5d9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff7b8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_7b8 = local_48;
  do {
    local_7b8 = local_7b8 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_7b8 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_5b9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_592);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_592 + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getaddressesbylabel()
{
    return RPCHelpMan{"getaddressesbylabel",
                "\nReturns the list of addresses assigned the specified label.\n",
                {
                    {"label", RPCArg::Type::STR, RPCArg::Optional::NO, "The label."},
                },
                RPCResult{
                    RPCResult::Type::OBJ_DYN, "", "json object with addresses as keys",
                    {
                        {RPCResult::Type::OBJ, "address", "json object with information about address",
                        {
                            {RPCResult::Type::STR, "purpose", "Purpose of address (\"send\" for sending address, \"receive\" for receiving address)"},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getaddressesbylabel", "\"tabby\"")
            + HelpExampleRpc("getaddressesbylabel", "\"tabby\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    const std::string label{LabelFromValue(request.params[0])};

    // Find all addresses that have the given label
    UniValue ret(UniValue::VOBJ);
    std::set<std::string> addresses;
    pwallet->ForEachAddrBookEntry([&](const CTxDestination& _dest, const std::string& _label, bool _is_change, const std::optional<AddressPurpose>& _purpose) {
        if (_is_change) return;
        if (_label == label) {
            std::string address = EncodeDestination(_dest);
            // CWallet::m_address_book is not expected to contain duplicate
            // address strings, but build a separate set as a precaution just in
            // case it does.
            bool unique = addresses.emplace(address).second;
            CHECK_NONFATAL(unique);
            // UniValue::pushKV checks if the key exists in O(N)
            // and since duplicate addresses are unexpected (checked with
            // std::set in O(log(N))), UniValue::pushKVEnd is used instead,
            // which currently is O(1).
            UniValue value(UniValue::VOBJ);
            value.pushKV("purpose", _purpose ? PurposeToString(*_purpose) : "unknown");
            ret.pushKVEnd(address, std::move(value));
        }
    });

    if (ret.empty()) {
        throw JSONRPCError(RPC_WALLET_INVALID_LABEL_NAME, std::string("No addresses with label " + label));
    }

    return ret;
},
    };
}